

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O0

void __thiscall
bioparser::test::BioparserPafTest_CompressedFormatError_Test::
~BioparserPafTest_CompressedFormatError_Test(BioparserPafTest_CompressedFormatError_Test *this)

{
  BioparserPafTest_CompressedFormatError_Test *this_local;
  
  BioparserPafTest::~BioparserPafTest(&this->super_BioparserPafTest);
  return;
}

Assistant:

TEST_F(BioparserPafTest, CompressedFormatError) {
  Setup("sample.mhap.gz");
  try {
    o = p->Parse(-1);
  } catch (std::invalid_argument& exception) {
    EXPECT_STREQ(
        exception.what(),
        "[bioparser::PafParser] error: invalid file format");
  }
}